

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  byte *pbVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  string *psVar5;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  FileOptions *pFVar6;
  FileOptions *pFVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  psVar5 = proto->name_;
  if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar5 = (string *)operator_new(0x20);
    (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
    psVar5->_M_string_length = 0;
    (psVar5->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar5;
  }
  std::__cxx11::string::_M_assign((string *)psVar5);
  if (*(long *)(*(long *)(this + 8) + 8) != 0) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 2;
    psVar5 = proto->package_;
    if (psVar5 == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar5 = (string *)operator_new(0x20);
      (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
      psVar5->_M_string_length = 0;
      (psVar5->field_2)._M_local_buf[0] = '\0';
      proto->package_ = psVar5;
    }
    std::__cxx11::string::_M_assign((string *)psVar5);
  }
  if (0 < *(int *)(this + 0x18)) {
    lVar9 = 0;
    do {
      iVar2 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar3 = (proto->dependency_).super_RepeatedPtrFieldBase.elements_;
        (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        psVar5 = (string *)ppvVar3[iVar2];
      }
      else {
        if (iVar8 == (proto->dependency_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->dependency_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->dependency_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        psVar5 = internal::StringTypeHandlerBase::New_abi_cxx11_();
        ppvVar3 = (proto->dependency_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
        (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = psVar5;
      }
      std::__cxx11::string::_M_assign((string *)psVar5);
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this + 0x18));
  }
  if (0 < *(int *)(this + 0x28)) {
    lVar9 = 0;
    do {
      iVar2 = *(int *)(*(long *)(this + 0x30) + lVar9 * 4);
      iVar8 = (proto->public_dependency_).current_size_;
      if (iVar8 == (proto->public_dependency_).total_size_) {
        RepeatedField<int>::Reserve(&proto->public_dependency_,iVar8 + 1);
        iVar8 = (proto->public_dependency_).current_size_;
      }
      (proto->public_dependency_).current_size_ = iVar8 + 1;
      (proto->public_dependency_).elements_[iVar8] = iVar2;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this + 0x28));
  }
  if (0 < *(int *)(this + 0x38)) {
    lVar9 = 0;
    do {
      iVar2 = *(int *)(*(long *)(this + 0x40) + lVar9 * 4);
      iVar8 = (proto->weak_dependency_).current_size_;
      if (iVar8 == (proto->weak_dependency_).total_size_) {
        RepeatedField<int>::Reserve(&proto->weak_dependency_,iVar8 + 1);
        iVar8 = (proto->weak_dependency_).current_size_;
      }
      (proto->weak_dependency_).current_size_ = iVar8 + 1;
      (proto->weak_dependency_).elements_[iVar8] = iVar2;
      lVar9 = lVar9 + 1;
    } while (lVar9 < *(int *)(this + 0x38));
  }
  if (0 < *(int *)(this + 0x48)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar4 = *(long *)(this + 0x50);
      iVar2 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.elements_;
        (proto->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        proto_00 = (DescriptorProto *)ppvVar3[iVar2];
      }
      else {
        if (iVar8 == (proto->message_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->message_type_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->message_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        proto_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = proto_00;
      }
      Descriptor::CopyTo((Descriptor *)(lVar4 + lVar10),proto_00);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x78;
    } while (lVar9 < *(int *)(this + 0x48));
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar4 = *(long *)(this + 0x60);
      iVar2 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar3 = (proto->enum_type_).super_RepeatedPtrFieldBase.elements_;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        proto_01 = (EnumDescriptorProto *)ppvVar3[iVar2];
      }
      else {
        if (iVar8 == (proto->enum_type_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->enum_type_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->enum_type_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        proto_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
        ppvVar3 = (proto->enum_type_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = proto_01;
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar4 + lVar10),proto_01);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x38;
    } while (lVar9 < *(int *)(this + 0x58));
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar4 = *(long *)(this + 0x70);
      iVar2 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->service_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar3 = (proto->service_).super_RepeatedPtrFieldBase.elements_;
        (proto->service_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        proto_02 = (ServiceDescriptorProto *)ppvVar3[iVar2];
      }
      else {
        if (iVar8 == (proto->service_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->service_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->service_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->service_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        proto_02 = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
        ppvVar3 = (proto->service_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        (proto->service_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = proto_02;
      }
      ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar4 + lVar10),proto_02);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x30;
    } while (lVar9 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      lVar4 = *(long *)(this + 0x80);
      iVar2 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar8 = (proto->extension_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar2 < iVar8) {
        ppvVar3 = (proto->extension_).super_RepeatedPtrFieldBase.elements_;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        proto_03 = (FieldDescriptorProto *)ppvVar3[iVar2];
      }
      else {
        if (iVar8 == (proto->extension_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->extension_).super_RepeatedPtrFieldBase,iVar8 + 1);
          iVar8 = (proto->extension_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (proto->extension_).super_RepeatedPtrFieldBase.allocated_size_ = iVar8 + 1;
        proto_03 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar3 = (proto->extension_).super_RepeatedPtrFieldBase.elements_;
        iVar2 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
        ppvVar3[iVar2] = proto_03;
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar4 + lVar10),proto_03);
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x78;
    } while (lVar9 < *(int *)(this + 0x78));
  }
  pFVar7 = *(FileOptions **)(this + 0x88);
  pFVar6 = FileOptions::default_instance();
  if (pFVar7 != pFVar6) {
    pbVar1 = (byte *)((long)proto->_has_bits_ + 1);
    *pbVar1 = *pbVar1 | 2;
    pFVar7 = proto->options_;
    if (pFVar7 == (FileOptions *)0x0) {
      pFVar7 = (FileOptions *)operator_new(0x88);
      FileOptions::FileOptions(pFVar7);
      proto->options_ = pFVar7;
    }
    FileOptions::CopyFrom(pFVar7,*(FileOptions **)(this + 0x88));
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}